

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boss.cpp
# Opt level: O0

void __thiscall Boss::Boss(Boss *this,Person *person,Address *address,Employee *employee,Boss *boss)

{
  Address local_90;
  Boss *local_30;
  Boss *boss_local;
  Employee *employee_local;
  Address *address_local;
  Person *person_local;
  Boss *this_local;
  
  local_30 = boss;
  boss_local = (Boss *)employee;
  employee_local = (Employee *)address;
  address_local = (Address *)person;
  person_local = (Person *)this;
  Address::Address(&local_90,address);
  Employee::Employee(&this->super_Employee,person,&local_90,&boss_local->super_Employee);
  Address::~Address(&local_90);
  (this->super_Employee).super_Person._vptr_Person = (_func_int **)&PTR_validate_0014aa10;
  this->numberOfEmployee = local_30->numberOfEmployee;
  return;
}

Assistant:

Boss::Boss(const Person &person, Address address, const Employee &employee, const Boss &boss) : Employee(person, address, employee) {

    this->numberOfEmployee = boss.numberOfEmployee;
}